

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O3

string * __thiscall
cmTimestamp::CreateTimestampFromTimeT
          (string *__return_storage_ptr__,cmTimestamp *this,time_t timeT,string *formatString,
          bool utcFlag)

{
  char flag;
  pointer pcVar1;
  tm *ptVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  time_t local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string local_88;
  tm local_68;
  
  local_98 = timeT;
  if (formatString->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)formatString,0,(char *)0x0,0x64cf3e);
    if (utcFlag) {
      std::__cxx11::string::append((char *)formatString);
      goto LAB_0041a5a5;
    }
  }
  else if (utcFlag) {
LAB_0041a5a5:
    ptVar2 = gmtime(&local_98);
    goto LAB_0041a5b7;
  }
  ptVar2 = localtime(&local_98);
LAB_0041a5b7:
  if (ptVar2 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_68.tm_zone = ptVar2->tm_zone;
    local_68.tm_sec = ptVar2->tm_sec;
    local_68.tm_min = ptVar2->tm_min;
    local_68.tm_hour = ptVar2->tm_hour;
    local_68.tm_mday = ptVar2->tm_mday;
    local_68.tm_mon = ptVar2->tm_mon;
    local_68.tm_year = ptVar2->tm_year;
    local_68.tm_wday = ptVar2->tm_wday;
    local_68.tm_yday = ptVar2->tm_yday;
    local_68.tm_isdst = ptVar2->tm_isdst;
    local_68._36_4_ = *(undefined4 *)&ptVar2->field_0x24;
    local_68.tm_gmtoff = ptVar2->tm_gmtoff;
    local_90 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_90;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar3 = formatString->_M_string_length;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pcVar1 = (formatString->_M_dataplus)._M_p;
        uVar5 = uVar4 + 1;
        if ((uVar5 < uVar3) && (flag = pcVar1[uVar5], flag != '\0' && pcVar1[uVar4] == '%')) {
          AddTimestampComponent_abi_cxx11_(&local_88,this,flag,&local_68,local_98);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          uVar5 = uVar4 + 2;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        uVar3 = formatString->_M_string_length;
        uVar4 = uVar5;
      } while (uVar5 < uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CreateTimestampFromTimeT(time_t timeT,
                                                  std::string formatString,
                                                  bool utcFlag) const
{
  if (formatString.empty()) {
    formatString = "%Y-%m-%dT%H:%M:%S";
    if (utcFlag) {
      formatString += "Z";
    }
  }

  struct tm timeStruct;
  memset(&timeStruct, 0, sizeof(timeStruct));

  struct tm* ptr = (struct tm*)CM_NULLPTR;
  if (utcFlag) {
    ptr = gmtime(&timeT);
  } else {
    ptr = localtime(&timeT);
  }

  if (ptr == CM_NULLPTR) {
    return std::string();
  }

  timeStruct = *ptr;

  std::string result;
  for (std::string::size_type i = 0; i < formatString.size(); ++i) {
    char c1 = formatString[i];
    char c2 = (i + 1 < formatString.size()) ? formatString[i + 1]
                                            : static_cast<char>(0);

    if (c1 == '%' && c2 != 0) {
      result += AddTimestampComponent(c2, timeStruct, timeT);
      ++i;
    } else {
      result += c1;
    }
  }

  return result;
}